

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmConsoleMain::CVmConsoleMain(CVmConsoleMain *this)

{
  CVmFormatterLog *pCVar1;
  CVmConsole *console;
  CVmFormatterLog *this_00;
  CVmConsole *in_RDI;
  CCharmapToLocal *in_stack_ffffffffffffffb8;
  CVmLogConsoleManager *in_stack_ffffffffffffffc0;
  
  CVmConsole::CVmConsole(in_RDI);
  in_RDI->_vptr_CVmConsole = (_func_int **)&PTR_delete_obj_003e2080;
  pCVar1 = (CVmFormatterLog *)operator_new(0x18);
  CVmBannerManager::CVmBannerManager((CVmBannerManager *)in_stack_ffffffffffffffc0);
  in_RDI[1].log_str_ = pCVar1;
  pCVar1 = (CVmFormatterLog *)operator_new(0x18);
  CVmLogConsoleManager::CVmLogConsoleManager(in_stack_ffffffffffffffc0);
  *(CVmFormatterLog **)&in_RDI[1].field_0x18 = pCVar1;
  console = (CVmConsole *)operator_new(0xf040);
  CVmFormatterMain::CVmFormatterMain
            ((CVmFormatterMain *)pCVar1,console,(size_t)in_stack_ffffffffffffffc0);
  in_RDI[1]._vptr_CVmConsole = (_func_int **)console;
  (**(code **)(*in_RDI[1]._vptr_CVmConsole + 8))();
  in_RDI->disp_str_ = (CVmFormatter *)in_RDI[1]._vptr_CVmConsole;
  this_00 = (CVmFormatterLog *)operator_new(0xf060);
  CVmFormatterLog::CVmFormatterLog(pCVar1,console,(int)((ulong)this_00 >> 0x20));
  in_RDI->log_str_ = this_00;
  CVmFormatter::set_charmap(&this_00->super_CVmFormatter,in_stack_ffffffffffffffb8);
  (*(in_RDI->log_str_->super_CVmFormatter)._vptr_CVmFormatter[1])();
  in_RDI->field_0x18 = in_RDI->field_0x18 & 0xfe | 1;
  in_RDI[1].disp_str_ = (CVmFormatter *)0x0;
  S_read_in_progress = 0;
  S_read_buf[0] = '\0';
  return;
}

Assistant:

CVmConsoleMain::CVmConsoleMain(VMG0_)
{
    /* create the system banner manager */
    banner_manager_ = new CVmBannerManager();

    /* create the log console manager */
    log_console_manager_ = new CVmLogConsoleManager();

    /* create and initialize our display stream */
    main_disp_str_ = new CVmFormatterMain(this, 256);
    main_disp_str_->init();

    /* initially send text to the main display stream */
    disp_str_ = main_disp_str_;

    /* 
     *   Create our log stream.  The main console always has a log stream,
     *   even when it's not in use, so that we can keep the log stream's
     *   state synchronized with the display stream in preparation for
     *   activation.  
     */
    log_str_ = new CVmFormatterLog(this, 80);

    /* 
     *   use the default log file character mapper - on some systems, files
     *   don't use the same character set as the display 
     */
    log_str_->set_charmap(G_cmap_to_log);

    /* initialize the log stream */
    log_str_->init();

    /* 
     *   the log stream is initially enabled (this is separate from the log
     *   file being opened; it merely indicates that we send output
     *   operations to the log stream for processing) 
     */
    log_enabled_ = TRUE;

    /* we don't have a statusline formatter until asked for one */
    statline_str_ = 0;

    /* reset statics */
    S_read_in_progress = FALSE;
    S_read_buf[0] = '\0';
}